

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O0

int BIO_write_all(BIO *bio,void *data,size_t len)

{
  int iVar1;
  int local_4c;
  void *pvStack_30;
  int ret;
  uint8_t *data_u8;
  size_t len_local;
  void *data_local;
  BIO *bio_local;
  
  pvStack_30 = data;
  data_u8 = (uint8_t *)len;
  while( true ) {
    if (data_u8 == (uint8_t *)0x0) {
      return 1;
    }
    if (data_u8 < (uint8_t *)0x80000000) {
      local_4c = (int)data_u8;
    }
    else {
      local_4c = 0x7fffffff;
    }
    iVar1 = BIO_write((BIO *)bio,pvStack_30,local_4c);
    if (iVar1 < 1) break;
    pvStack_30 = (void *)((long)pvStack_30 + (long)iVar1);
    data_u8 = data_u8 + -(long)iVar1;
  }
  return 0;
}

Assistant:

int BIO_write_all(BIO *bio, const void *data, size_t len) {
  const uint8_t *data_u8 = reinterpret_cast<const uint8_t *>(data);
  while (len > 0) {
    int ret = BIO_write(bio, data_u8, len > INT_MAX ? INT_MAX : (int)len);
    if (ret <= 0) {
      return 0;
    }
    data_u8 += ret;
    len -= ret;
  }
  return 1;
}